

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect GetBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  ImRect IVar6;
  ImRect IVar7;
  ImRect IVar8;
  
  fVar1 = (window->Pos).x;
  fVar2 = (window->Pos).y;
  fVar4 = (window->Size).x + fVar1;
  fVar5 = (window->Size).y + fVar2;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar4 = fVar4 + -1.0;
    fVar5 = fVar5 + -1.0;
  }
  switch(border_n) {
  case 0:
    IVar6.Min.x = fVar1 + perp_padding;
    IVar6.Max.x = fVar4 - perp_padding;
    IVar6.Max.y = thickness + fVar2;
    IVar6.Min.y = fVar2;
    return IVar6;
  case 1:
    IVar3.x = fVar4 - thickness;
    IVar3.y = fVar2 + perp_padding;
    break;
  case 2:
    IVar7.Min.x = fVar1 + perp_padding;
    IVar7.Min.y = fVar5 - thickness;
    IVar7.Max.x = fVar4 - perp_padding;
    IVar7.Max.y = fVar5;
    return IVar7;
  case 3:
    fVar4 = thickness + fVar1;
    IVar3.y = fVar2 + perp_padding;
    IVar3.x = fVar1;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1625,"ImRect GetBorderRect(ImGuiWindow *, int, float, float)");
  }
  IVar8.Max.y = fVar5 - perp_padding;
  IVar8.Max.x = fVar4;
  IVar8.Min = IVar3;
  return IVar8;
}

Assistant:

static ImRect GetBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y,                rect.Max.x - perp_padding, rect.Min.y + thickness);
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x,                rect.Max.y - perp_padding);
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y);
    if (border_n == 3) return ImRect(rect.Min.x,                rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);
    IM_ASSERT(0);
    return ImRect();
}